

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void spirv_cross::inner::join_helper<char,std::__cxx11::string_const&,char>
               (StringStream<4096UL,_4096UL> *stream,char *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char *ts_1)

{
  StringStream<4096UL,_4096UL>::operator<<(stream,*t);
  join_helper<std::__cxx11::string_const&,char>(stream,ts,ts_1);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}